

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::iterate
          (TextureLayerAttachmentTest *this)

{
  GLenum texture_target;
  GLint GVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 err;
  GLuint GVar6;
  undefined4 extraout_var;
  long lVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  byte bVar8;
  GLint max_color_attachments;
  GLuint layers_counts [3];
  uint local_58;
  int local_44 [3];
  long local_38;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar2) || (bVar3)) {
    (**(code **)(CONCAT44(extraout_var,iVar5) + 0x868))(0x8cdf);
    err = (**(code **)(CONCAT44(extraout_var,iVar5) + 0x800))();
    glu::checkError(err,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x33f);
    bVar8 = 1;
    lVar7 = 0;
    do {
      texture_target = (&s_targets)[lVar7];
      local_44[0] = (uint)(texture_target == 0x9009) * 5 + 1;
      local_44[1] = 0xc0;
      local_38 = lVar7;
      local_44[2] = MaxTextureLayers(this,texture_target);
      for (local_58 = 1; GVar6 = MaxTextureLevels(this,texture_target), local_58 <= GVar6;
          local_58 = local_58 + 1) {
        lVar7 = 0;
        do {
          GVar1 = local_44[lVar7];
          iVar5 = 0;
          do {
            bVar2 = Test(this,iVar5 + 0x8ce0,true,texture_target,0x8058,local_58,GVar1);
            Clean(this);
            bVar8 = bVar8 & bVar2;
            iVar5 = iVar5 + 1;
          } while (iVar5 < 8);
          if (texture_target != 0x806f) {
            GVar1 = local_44[lVar7];
            bVar2 = Test(this,0x8d00,false,texture_target,0x81a6,local_58,GVar1);
            Clean(this);
            bVar3 = Test(this,0x821a,false,texture_target,0x88f0,local_58,GVar1);
            Clean(this);
            bVar4 = Test(this,0x8d20,false,texture_target,0x8d48,local_58,GVar1);
            Clean(this);
            bVar8 = bVar2 & bVar8 & bVar3 & bVar4;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
      }
      lVar7 = local_38 + 1;
    } while (lVar7 != 4);
    Clean(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar8 == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureLayerAttachmentTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		glw::GLint max_color_attachments = 8 /* Specification minimum OpenGL 4.5 Core Profile p. 627 */;

		gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		for (glw::GLuint i = 0; i < s_targets_count; ++i)
		{
			glw::GLuint layers_counts[] = { (GL_TEXTURE_CUBE_MAP_ARRAY == (glw::GLuint)s_targets[i]) ? 6u : 1u,
											(GL_TEXTURE_CUBE_MAP_ARRAY == (glw::GLuint)s_targets[i]) ? 192u : 192u,
											MaxTextureLayers(s_targets[i]) };

			glw::GLuint layers_counts_count = sizeof(layers_counts) / sizeof(layers_counts[0]);

			for (glw::GLuint j = 1; j <= MaxTextureLevels(s_targets[i]); ++j)
			{
				for (glw::GLuint k = 0; k < layers_counts_count; ++k)
				{
					for (glw::GLint l = 0; l < max_color_attachments; ++l)
					{
						is_ok &= Test(GL_COLOR_ATTACHMENT0 + l, true, s_targets[i], GL_RGBA8, j, layers_counts[k]);
						Clean();
					}

					if (GL_TEXTURE_3D != s_targets[i])
					{
						is_ok &=
							Test(GL_DEPTH_ATTACHMENT, false, s_targets[i], GL_DEPTH_COMPONENT24, j, layers_counts[k]);
						Clean();

						is_ok &= Test(GL_DEPTH_STENCIL_ATTACHMENT, false, s_targets[i], GL_DEPTH24_STENCIL8, j,
									  layers_counts[k]);
						Clean();

						is_ok &=
							Test(GL_STENCIL_ATTACHMENT, false, s_targets[i], GL_STENCIL_INDEX8, j, layers_counts[k]);
						Clean();
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	Clean();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}